

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O1

void __thiscall GGSock::Communicator::Data::doRead(Data *this)

{
  TSocketDescriptor *sock;
  vector<char,_std::allocator<char>_> *this_00;
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  _Any_data *p_Var5;
  mapped_type *this_01;
  size_t __n;
  uint uVar6;
  TMessageType type;
  TMessageType local_6a;
  pointer local_68;
  _Any_data *local_60;
  TSocketDescriptor *local_58;
  vector<char,_std::allocator<char>_> *local_50;
  long local_48;
  long local_40;
  uint local_34;
  
  sock = &this->sdpeer;
  sVar3 = recv(this->sdpeer,&this->bufferHeaderRecv,6,0);
  iVar2 = (int)sVar3;
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    if (*piVar4 == 0xb) {
      return;
    }
    this->isConnected = false;
    anon_unknown.dwarf_783c::closeAndReset(sock);
    anon_unknown.dwarf_783c::closeAndReset(&this->sd);
    if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      return;
    }
    local_68 = (pointer)CONCAT62(local_68._2_6_,(short)*piVar4);
  }
  else {
    if (iVar2 == 6) {
      uVar6 = *(uint *)(this->bufferHeaderRecv)._M_elems;
      local_6a = *(TMessageType *)((this->bufferHeaderRecv)._M_elems + 4);
      if (uVar6 == 6) {
        p_Var5 = (_Any_data *)
                 std::
                 map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                 ::operator[](&this->messageCallback,&local_6a);
        if (*(long *)(p_Var5 + 1) == 0) {
          return;
        }
        local_68 = (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_34 = 0;
        (**(code **)((long)p_Var5 + 0x18))(p_Var5,&local_68,&local_34);
        return;
      }
      if (uVar6 < 7) {
        return;
      }
      this->lastMessageType = local_6a;
      uVar6 = uVar6 - 6;
      this->leftToReceive = uVar6;
      this->offsetReceive = 0;
      this_00 = &this->bufferDataRecv;
      if (*(int *)&(this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start < (int)uVar6) {
        printf("Extend receive buffer to %d bytes\n");
        std::vector<char,_std::allocator<char>_>::resize(this_00,(long)this->leftToReceive);
      }
      uVar1 = this->leftToReceive;
      local_50 = this_00;
      if ((int)uVar1 < 1) {
        this_01 = std::
                  map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                  ::operator[](&this->messageCallback,&local_6a);
        if ((this_01->super__Function_base)._M_manager == (_Manager_type)0x0) {
          return;
        }
        std::function<unsigned_short_(const_char_*,_unsigned_int)>::operator()
                  (this_01,(local_50->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start,uVar6);
        return;
      }
      local_58 = &this->sd;
      local_60 = (_Any_data *)&this->errorCallback;
      local_48 = 3;
      local_40 = 1;
      __n = (size_t)uVar1;
      if (0xffff < (int)uVar1) {
        __n = 0x10000;
      }
      sVar3 = recv(this->sdpeer,
                   (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + this->offsetReceive,__n,0);
      iVar2 = (int)sVar3;
      if (iVar2 < 0) {
        piVar4 = __errno_location();
        uVar6 = 2;
        if (*piVar4 != 0xb) {
          this->isConnected = false;
          anon_unknown.dwarf_783c::closeAndReset(sock);
          anon_unknown.dwarf_783c::closeAndReset(local_58);
          if ((this->errorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
            local_68 = (pointer)CONCAT62(local_68._2_6_,(short)*piVar4);
            (*(this->errorCallback)._M_invoker)(local_60,(short *)&local_68);
            (*(code *)((long)&DAT_00112010 + (long)(int)(&DAT_00112010)[local_48]))();
            return;
          }
          uVar6 = 3;
        }
      }
      else if (iVar2 == 0) {
        this->isListening = false;
        this->isConnected = false;
        anon_unknown.dwarf_783c::closeAndReset(sock);
        anon_unknown.dwarf_783c::closeAndReset(local_58);
        if ((this->errorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          piVar4 = __errno_location();
          local_68 = (pointer)CONCAT62(local_68._2_6_,(short)*piVar4);
          (*(this->errorCallback)._M_invoker)(local_60,(short *)&local_68);
          (*(code *)((long)&DAT_00112010 + (long)(int)(&DAT_00112010)[local_40]))();
          return;
        }
        uVar6 = 1;
      }
      else {
        this->leftToReceive = this->leftToReceive - iVar2;
        this->offsetReceive = this->offsetReceive + iVar2;
        uVar6 = 0;
      }
      (*(code *)((long)&DAT_00112010 + (long)(int)(&DAT_00112010)[uVar6]))();
      return;
    }
    if (iVar2 != 0) {
      return;
    }
    this->isListening = false;
    this->isConnected = false;
    anon_unknown.dwarf_783c::closeAndReset(sock);
    anon_unknown.dwarf_783c::closeAndReset(&this->sd);
    if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      return;
    }
    piVar4 = __errno_location();
    local_68 = (pointer)CONCAT62(local_68._2_6_,(short)*piVar4);
  }
  (*(this->errorCallback)._M_invoker)((_Any_data *)&this->errorCallback,(short *)&local_68);
  return;
}

Assistant:

void doRead() {
            int rc = (int) recv(sdpeer, bufferHeaderRecv.data(), bufferHeaderRecv.size(), 0);
            if (rc < 0) {
                if (e_wouldBlock() == false) {
                    isConnected = false;
                    ::closeAndReset(sdpeer);
                    ::closeAndReset(sd);

                    TErrorCode errorCode = errno;
                    if (errorCallback) {
                        errorCallback(errorCode);
                    }
                }
                return;
            }

            if (rc == 0) {
                isConnected = false;
                isListening = false;
                ::closeAndReset(sdpeer);
                ::closeAndReset(sd);

                TErrorCode errorCode = errno;
                if (errorCallback) {
                    errorCallback(errorCode);
                }

                return;
            }

            //printf("  %d bytes received, %d %d\n", rc,
            //       (int)(*reinterpret_cast<int32_t *>(bufferHeaderRecv.data())),
            //       (int)(*reinterpret_cast<int16_t *>(bufferHeaderRecv.data() + sizeof(int32_t)))
            //       );

            if (rc == (int) bufferHeaderRecv.size()) {
                TBufferSize size = 0;
                TMessageType type = 0;
                memcpy(&size, bufferHeaderRecv.data(), sizeof(size));
                memcpy(&type, bufferHeaderRecv.data() + sizeof(size), sizeof(type));
                if (size == ::MessageHeader::getSizeInBytes()) {
                    if (const auto & cb = messageCallback[type]) {
                        cb(bufferDataRecv.data(), 0);
                    }
                } else if (size > ::MessageHeader::getSizeInBytes()) {
                    lastMessageType = type;
                    leftToReceive = size - ::MessageHeader::getSizeInBytes();
                    offsetReceive = 0;
                    if (leftToReceive > (int) bufferDataRecv.size()) {
                        printf("Extend receive buffer to %d bytes\n", (int) bufferDataRecv.size());
                        bufferDataRecv.resize(leftToReceive);
                    }

                    while (leftToReceive > 0) {
                        //printf("left = %d\n", (int) leftToReceive);
                        size_t curSize = (std::min)(65536, (int) leftToReceive);

                        int rc = (int) recv(sdpeer, bufferDataRecv.data() + offsetReceive, curSize, 0);
                        if (rc < 0) {
                            if (e_wouldBlock() == false) {
                                isConnected = false;
                                ::closeAndReset(sdpeer);
                                ::closeAndReset(sd);

                                if (errorCallback) {
                                    TErrorCode errorCode = errno;
                                    errorCallback(errorCode);
                                }

                                break;
                            }

                            continue;
                        }

                        if (rc == 0) {
                            isConnected = false;
                            isListening = false;
                            ::closeAndReset(sdpeer);
                            ::closeAndReset(sd);

                            TErrorCode errorCode = errno;
                            if (errorCallback) errorCallback(errorCode);

                            return;
                        }

                        leftToReceive -= rc;
                        offsetReceive += rc;
                    }

                    if (const auto & cb = messageCallback[type]) {
                        cb(bufferDataRecv.data(), size - ::MessageHeader::getSizeInBytes());
                    }
                } else {
                    // error
                }
            }
        }